

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_TIFFPredictor.cc
# Opt level: O0

void __thiscall Pl_TIFFPredictor::finish(Pl_TIFFPredictor *this)

{
  uint uVar1;
  bool bVar2;
  size_type sVar3;
  Pipeline *pPVar4;
  value_type_conflict local_21;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_20;
  const_iterator local_18;
  Pl_TIFFPredictor *local_10;
  Pl_TIFFPredictor *this_local;
  
  local_10 = this;
  bVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty(&this->cur_row);
  if (!bVar2) {
    local_20._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(&this->cur_row);
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                *)&local_18,&local_20);
    uVar1 = this->bytes_per_row;
    sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->cur_row);
    local_21 = '\0';
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::insert
              (&this->cur_row,local_18,uVar1 - sVar3,&local_21);
    processRow(this);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear(&this->cur_row);
  pPVar4 = Pipeline::next(&this->super_Pipeline);
  (*pPVar4->_vptr_Pipeline[3])();
  return;
}

Assistant:

void
Pl_TIFFPredictor::finish()
{
    if (!cur_row.empty()) {
        // write partial row
        cur_row.insert(cur_row.end(), bytes_per_row - cur_row.size(), 0);
        processRow();
    }
    cur_row.clear();
    next()->finish();
}